

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O0

X509 * X509_new(void)

{
  X509_CINF *pXVar1;
  X509_ALGOR *pXVar2;
  ASN1_BIT_STRING *pAVar3;
  X509 *ret;
  
  ret = x509_new_null();
  if ((X509 *)ret == (X509 *)0x0) {
    ret = (X509 *)0x0;
  }
  else {
    pXVar1 = X509_CINF_new();
    ((X509 *)ret)->cert_info = pXVar1;
    pXVar2 = X509_ALGOR_new();
    ((X509 *)ret)->sig_alg = pXVar2;
    pAVar3 = ASN1_BIT_STRING_new();
    ((X509 *)ret)->signature = pAVar3;
    if (((((X509 *)ret)->cert_info == (X509_CINF *)0x0) ||
        (((X509 *)ret)->sig_alg == (X509_ALGOR *)0x0)) ||
       (((X509 *)ret)->signature == (ASN1_BIT_STRING *)0x0)) {
      X509_free((X509 *)ret);
      ret = (X509 *)0x0;
    }
  }
  return (X509 *)ret;
}

Assistant:

X509 *X509_new(void) {
  X509 *ret = x509_new_null();
  if (ret == NULL) {
    return NULL;
  }

  ret->cert_info = X509_CINF_new();
  ret->sig_alg = X509_ALGOR_new();
  ret->signature = ASN1_BIT_STRING_new();
  if (ret->cert_info == NULL || ret->sig_alg == NULL ||
      ret->signature == NULL) {
    X509_free(ret);
    return NULL;
  }

  return ret;
}